

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O3

int kinLsBandDQJac(N_Vector u,N_Vector fu,SUNMatrix Jac,KINMem kin_mem,N_Vector tmp1,N_Vector tmp2)

{
  long *plVar1;
  void *pvVar2;
  int iVar3;
  sunindextype sVar4;
  sunindextype sVar5;
  sunindextype sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  sunindextype sVar12;
  long lVar13;
  long lVar14;
  sunrealtype *psVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long j;
  long lVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  long local_a0;
  long local_98;
  
  pvVar2 = kin_mem->kin_lmem;
  sVar4 = SUNBandMatrix_Columns(Jac);
  sVar5 = SUNBandMatrix_UpperBandwidth(Jac);
  sVar6 = SUNBandMatrix_LowerBandwidth(Jac);
  lVar7 = N_VGetArrayPointer(fu);
  lVar8 = N_VGetArrayPointer(tmp1);
  lVar9 = N_VGetArrayPointer(u);
  lVar10 = N_VGetArrayPointer(kin_mem->kin_uscale);
  lVar11 = N_VGetArrayPointer(tmp2);
  N_VScale(0x3ff0000000000000,u,tmp2);
  lVar18 = sVar6 + sVar5 + 1;
  sVar12 = sVar4;
  if (lVar18 < sVar4) {
    sVar12 = lVar18;
  }
  if (0 < sVar12) {
    local_98 = -sVar5;
    local_a0 = 0;
    lVar13 = 1;
    do {
      j = lVar13 + -1;
      lVar14 = j;
      do {
        dVar22 = ABS(*(double *)(lVar9 + lVar14 * 8));
        dVar23 = 1.0 / ABS(*(double *)(lVar10 + lVar14 * 8));
        if (dVar22 <= dVar23) {
          dVar22 = dVar23;
        }
        *(double *)(lVar11 + lVar14 * 8) =
             dVar22 * kin_mem->kin_sqrt_relfunc + *(double *)(lVar11 + lVar14 * 8);
        lVar14 = lVar14 + lVar18;
      } while (lVar14 < sVar4);
      iVar3 = (*kin_mem->kin_func)(tmp2,tmp1,kin_mem->kin_user_data);
      lVar14 = local_a0;
      lVar20 = local_98;
      if (iVar3 != 0) {
        return iVar3;
      }
      do {
        lVar19 = 0;
        if (0 < lVar20) {
          lVar19 = lVar20;
        }
        *(undefined8 *)(lVar11 + j * 8) = *(undefined8 *)(lVar9 + j * 8);
        psVar15 = SUNBandMatrix_Column(Jac,j);
        lVar17 = j - sVar5;
        if (lVar17 < 1) {
          lVar17 = 0;
        }
        lVar16 = sVar6 + j;
        if (sVar4 + -1 <= sVar6 + j) {
          lVar16 = sVar4 + -1;
        }
        if (lVar17 <= lVar16) {
          dVar22 = ABS(*(double *)(lVar9 + j * 8));
          dVar23 = 1.0 / ABS(*(double *)(lVar10 + j * 8));
          if (dVar22 <= dVar23) {
            dVar22 = dVar23;
          }
          dVar23 = kin_mem->kin_sqrt_relfunc;
          lVar19 = lVar19 + -1;
          do {
            *(double *)((long)psVar15 + lVar19 * 8 + lVar14 + 8) =
                 (*(double *)(lVar8 + 8 + lVar19 * 8) - *(double *)(lVar7 + 8 + lVar19 * 8)) *
                 (1.0 / (dVar22 * dVar23));
            lVar19 = lVar19 + 1;
          } while (lVar19 < lVar16);
        }
        j = j + lVar18;
        lVar14 = lVar14 + ~(sVar5 + sVar6) * 8;
        lVar20 = lVar20 + lVar18;
      } while (j < sVar4);
      local_98 = local_98 + 1;
      local_a0 = local_a0 + -8;
      bVar21 = lVar13 != sVar12;
      lVar13 = lVar13 + 1;
    } while (bVar21);
  }
  plVar1 = (long *)((long)pvVar2 + 0x40);
  *plVar1 = *plVar1 + sVar12;
  return 0;
}

Assistant:

int kinLsBandDQJac(N_Vector u, N_Vector fu, SUNMatrix Jac, KINMem kin_mem,
                   N_Vector tmp1, N_Vector tmp2)
{
  sunrealtype inc, inc_inv;
  N_Vector futemp, utemp;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunindextype N, mupper, mlower;
  sunrealtype *col_j, *fu_data, *futemp_data, *u_data, *utemp_data, *uscale_data;
  KINLsMem kinls_mem;
  int retval = 0;

  /* access LsMem interface structure */
  kinls_mem = (KINLsMem)kin_mem->kin_lmem;

  /* access matrix dimensions */
  N      = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of u and fu */
  futemp = tmp1;
  utemp  = tmp2;

  /* Obtain pointers to the data for ewt, fy, futemp, y, ytemp */
  fu_data     = N_VGetArrayPointer(fu);
  futemp_data = N_VGetArrayPointer(futemp);
  u_data      = N_VGetArrayPointer(u);
  uscale_data = N_VGetArrayPointer(kin_mem->kin_uscale);
  utemp_data  = N_VGetArrayPointer(utemp);

  /* Load utemp with u */
  N_VScale(ONE, u, utemp);

  /* Set bandwidth and number of column groups for band differencing */
  width   = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  for (group = 1; group <= ngroups; group++)
  {
    /* Increment all utemp components in group */
    for (j = group - 1; j < N; j += width)
    {
      inc = kin_mem->kin_sqrt_relfunc *
            SUNMAX(SUNRabs(u_data[j]), ONE / SUNRabs(uscale_data[j]));
      utemp_data[j] += inc;
    }

    /* Evaluate f with incremented u */
    retval = kin_mem->kin_func(utemp, futemp, kin_mem->kin_user_data);
    if (retval != 0) { return (retval); }

    /* Restore utemp components, then form and load difference quotients */
    for (j = group - 1; j < N; j += width)
    {
      utemp_data[j] = u_data[j];
      col_j         = SUNBandMatrix_Column(Jac, j);
      inc           = kin_mem->kin_sqrt_relfunc *
            SUNMAX(SUNRabs(u_data[j]), ONE / SUNRabs(uscale_data[j]));
      inc_inv = ONE / inc;
      i1      = SUNMAX(0, j - mupper);
      i2      = SUNMIN(j + mlower, N - 1);
      for (i = i1; i <= i2; i++)
      {
        SM_COLUMN_ELEMENT_B(col_j, i, j) = inc_inv *
                                           (futemp_data[i] - fu_data[i]);
      }
    }
  }

  /* Increment counter nfeDQ */
  kinls_mem->nfeDQ += ngroups;

  return (0);
}